

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_enc.c
# Opt level: O2

void VP8TBufferInit(VP8TBuffer *b,int page_size)

{
  int iVar1;
  
  b->tokens = (uint16_t *)0x0;
  b->pages = (VP8Tokens *)0x0;
  b->last_page = &b->pages;
  b->left = 0;
  iVar1 = 0x2000;
  if (0x2000 < page_size) {
    iVar1 = page_size;
  }
  b->page_size = iVar1;
  b->error = 0;
  return;
}

Assistant:

void VP8TBufferInit(VP8TBuffer* const b, int page_size) {
  b->tokens = NULL;
  b->pages = NULL;
  b->last_page = &b->pages;
  b->left = 0;
  b->page_size = (page_size < MIN_PAGE_SIZE) ? MIN_PAGE_SIZE : page_size;
  b->error = 0;
}